

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O2

void ggml_compute_forward_sgn(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_type gVar2;
  ggml_tensor *src0;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  bool bVar13;
  FILE *__stream;
  char cVar14;
  ggml_bf16_t gVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int64_t ir;
  long lVar21;
  char *pcVar22;
  long lVar23;
  long lVar24;
  int64_t ir_2;
  undefined1 auVar25 [16];
  pair<long,_long> pVar26;
  undefined8 uStack_90;
  
  __stream = _stderr;
  src0 = dst->src[0];
  gVar1 = dst->type;
  gVar2 = src0->type;
  if (gVar2 == GGML_TYPE_BF16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 4) {
LAB_00128062:
          pcVar22 = "nb0 == sizeof(dst_t)";
          uStack_90 = 0x55;
          goto LAB_00128092;
        }
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[1];
          sVar4 = src0->nb[2];
          lVar5 = src0->ne[1];
          lVar24 = src0->ne[2];
          sVar6 = dst->nb[1];
          sVar8 = dst->nb[2];
          sVar9 = src0->nb[3];
          uVar7 = dst->ne[0];
          sVar10 = dst->nb[3];
          pVar26 = get_thread_range(params,src0);
          lVar24 = lVar24 * lVar5;
          for (lVar21 = pVar26.first; lVar21 < pVar26.second; lVar21 = lVar21 + 1) {
            lVar16 = lVar21 / lVar24;
            lVar23 = lVar21 % lVar24;
            lVar17 = lVar23 / lVar5;
            lVar23 = lVar23 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0->data;
            for (uVar18 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar18; uVar18 = uVar18 + 1) {
              auVar25 = ZEXT216(*(ushort *)
                                 ((long)pvVar12 +
                                 uVar18 * 2 + lVar23 * sVar3 + lVar16 * sVar9 + lVar17 * sVar4)) <<
                        0x10;
              uVar19 = vcmpss_avx512f(auVar25,ZEXT816(0) << 0x40,1);
              uVar20 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar25,1);
              bVar13 = (bool)((byte)uVar20 & 1);
              *(uint *)((long)pvVar11 +
                       uVar18 * 4 + lVar23 * sVar6 + lVar16 * sVar10 + lVar17 * sVar8) =
                   (uint)bVar13 * 0x3f800000 +
                   (uint)!bVar13 * (uint)((byte)uVar19 & 1) * -0x40800000;
            }
          }
          return;
        }
LAB_0012807b:
        pcVar22 = "nb00 == sizeof(src0_t)";
        uStack_90 = 0x56;
        goto LAB_00128092;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_BF16) goto LAB_00128011;
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00128062;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[1];
          sVar4 = src0->nb[2];
          sVar6 = src0->nb[3];
          lVar5 = src0->ne[1];
          lVar24 = src0->ne[2];
          uVar7 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar26 = get_thread_range(params,src0);
          lVar24 = lVar24 * lVar5;
          for (lVar21 = pVar26.first; lVar21 < pVar26.second; lVar21 = lVar21 + 1) {
            lVar16 = lVar21 / lVar24;
            lVar23 = lVar21 % lVar24;
            lVar17 = lVar23 / lVar5;
            lVar23 = lVar23 % lVar5;
            pvVar11 = src0->data;
            pvVar12 = dst->data;
            for (uVar18 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar18; uVar18 = uVar18 + 1) {
              auVar25 = ZEXT216(*(ushort *)
                                 ((long)pvVar11 +
                                 uVar18 * 2 + lVar23 * sVar3 + lVar16 * sVar6 + lVar17 * sVar4)) <<
                        0x10;
              uVar19 = vcmpss_avx512f(auVar25,ZEXT816(0) << 0x40,1);
              uVar20 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar25,1);
              bVar13 = (bool)((byte)uVar20 & 1);
              gVar15 = f32_to_bf16((float)((uint)bVar13 * 0x3f800000 +
                                          (uint)!bVar13 * (uint)((byte)uVar19 & 1) * -0x40800000));
              *(uint16_t *)
               ((long)pvVar12 + uVar18 * 2 + lVar23 * sVar8 + lVar16 * sVar10 + lVar17 * sVar9) =
                   gVar15.bits;
            }
          }
          return;
        }
        goto LAB_0012807b;
      }
    }
  }
  else if (gVar2 == GGML_TYPE_F16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_00128062;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar5 = src0->ne[1];
          lVar24 = src0->ne[2];
          sVar8 = dst->nb[2];
          sVar9 = dst->nb[3];
          uVar7 = dst->ne[0];
          sVar10 = dst->nb[1];
          pVar26 = get_thread_range(params,src0);
          lVar24 = lVar24 * lVar5;
          for (lVar21 = pVar26.first; lVar21 < pVar26.second; lVar21 = lVar21 + 1) {
            lVar16 = lVar21 / lVar24;
            lVar23 = lVar21 % lVar24;
            lVar17 = lVar23 / lVar5;
            lVar23 = lVar23 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0->data;
            for (uVar18 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar18; uVar18 = uVar18 + 1) {
              uVar19 = vcmpss_avx512f(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar12 +
                                                               uVar18 * 2 +
                                                               lVar23 * sVar6 + lVar16 * sVar4 +
                                                               lVar17 * sVar3) * 4)),
                                      ZEXT816(0) << 0x40,1);
              uVar20 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                      ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar12 +
                                                               uVar18 * 2 +
                                                               lVar23 * sVar6 + lVar16 * sVar4 +
                                                               lVar17 * sVar3) * 4)),1);
              bVar13 = (bool)((byte)uVar20 & 1);
              *(uint *)((long)pvVar11 +
                       uVar18 * 4 + lVar23 * sVar10 + lVar16 * sVar9 + lVar17 * sVar8) =
                   (uint)bVar13 * 0x3f800000 +
                   (uint)!bVar13 * (uint)((byte)uVar19 & 1) * -0x40800000;
            }
          }
          return;
        }
        goto LAB_0012807b;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto LAB_00128011;
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00128062;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar5 = src0->ne[1];
          lVar24 = src0->ne[2];
          uVar7 = dst->ne[0];
          pVar26 = get_thread_range(params,src0);
          lVar24 = lVar24 * lVar5;
          for (lVar21 = pVar26.first; lVar21 < pVar26.second; lVar21 = lVar21 + 1) {
            lVar16 = lVar21 % lVar24;
            for (uVar18 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar18; uVar18 = uVar18 + 1) {
              uVar19 = vcmpss_avx512f(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)src0->data +
                                                               uVar18 * 2 +
                                                               (lVar16 % lVar5) * sVar6 +
                                                               (lVar21 / lVar24) * sVar4 +
                                                               (lVar16 / lVar5) * sVar3) * 4)),
                                      ZEXT816(0) << 0x40,1);
              uVar20 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                      ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)src0->data +
                                                               uVar18 * 2 +
                                                               (lVar16 % lVar5) * sVar6 +
                                                               (lVar21 / lVar24) * sVar4 +
                                                               (lVar16 / lVar5) * sVar3) * 4)),1);
              bVar13 = (bool)((byte)uVar20 & 1);
              auVar25 = vcvtps2ph_f16c(ZEXT416((uint)bVar13 * 0x3f800000 +
                                               (uint)!bVar13 *
                                               (uint)((byte)uVar19 & 1) * -0x40800000),0);
              vpextrw_avx(auVar25,0);
            }
          }
          return;
        }
        goto LAB_0012807b;
      }
    }
  }
  else {
    if ((gVar2 != GGML_TYPE_F32) || (gVar1 != GGML_TYPE_F32)) {
LAB_00128011:
      uVar19 = ggml_type_name();
      uVar20 = ggml_type_name(src0->type);
      fprintf(__stream,"%s: unsupported types: dst: %s, src0: %s\n","unary_op",uVar19,uVar20);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                 ,0x78,"fatal error");
    }
    cVar14 = ggml_is_contiguous_1(src0);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_00128062;
      if (src0->nb[0] == 4) {
        sVar3 = src0->nb[1];
        sVar4 = src0->nb[2];
        lVar5 = src0->ne[1];
        lVar24 = src0->ne[2];
        sVar6 = src0->nb[3];
        uVar7 = dst->ne[0];
        sVar8 = dst->nb[1];
        sVar9 = dst->nb[2];
        sVar10 = dst->nb[3];
        pVar26 = get_thread_range(params,src0);
        lVar24 = lVar24 * lVar5;
        for (lVar21 = pVar26.first; lVar21 < pVar26.second; lVar21 = lVar21 + 1) {
          lVar16 = lVar21 / lVar24;
          lVar23 = lVar21 % lVar24;
          lVar17 = lVar23 / lVar5;
          lVar23 = lVar23 % lVar5;
          pvVar11 = dst->data;
          pvVar12 = src0->data;
          for (uVar18 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar18; uVar18 = uVar18 + 1) {
            auVar25 = ZEXT416(*(uint *)((long)pvVar12 +
                                       uVar18 * 4 + lVar23 * sVar3 + lVar16 * sVar6 + lVar17 * sVar4
                                       ));
            uVar19 = vcmpss_avx512f(auVar25,ZEXT816(0) << 0x40,1);
            uVar20 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar25,1);
            bVar13 = (bool)((byte)uVar20 & 1);
            *(uint *)((long)pvVar11 + uVar18 * 4 + lVar23 * sVar8 + lVar16 * sVar10 + lVar17 * sVar9
                     ) = (uint)bVar13 * 0x3f800000 +
                         (uint)!bVar13 * (uint)((byte)uVar19 & 1) * -0x40800000;
          }
        }
        return;
      }
      goto LAB_0012807b;
    }
  }
  pcVar22 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uStack_90 = 0x51;
LAB_00128092:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uStack_90,"GGML_ASSERT(%s) failed",pcVar22);
}

Assistant:

void ggml_compute_forward_sgn(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_sgn>(params, dst);
}